

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O0

void __thiscall IO::singleStates(IO *this,ModelInstance *model,string *filename)

{
  bool bVar1;
  reference piVar2;
  ostream *poVar3;
  iterator iStack_248;
  int thisstate;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  string local_220 [8];
  ofstream outstream;
  string *filename_local;
  ModelInstance *model_local;
  IO *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ofstream::open(local_220,(_Ios_Openmode)filename);
  __end1 = std::vector<int,_std::allocator<int>_>::begin(&model->states);
  iStack_248 = std::vector<int,_std::allocator<int>_>::end(&model->states);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffdb8);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_220,*piVar2);
    std::operator<<(poVar3,"\t");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((ostream *)local_220,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void IO::singleStates(ModelInstance *model, std::string filename) {
	std::ofstream outstream;
	outstream.open(filename, std::ios::app);
	for (int thisstate : model->states){
		outstream << thisstate << "\t";
	}
	outstream << std::endl;
	outstream.close();
}